

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2obs.cpp
# Opt level: O2

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"gal2obs",(allocator *)&local_70);
  CEExecOptions::CEExecOptions(in_RDI,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)&local_30);
  std::operator+(&local_50,&local_30,
                 "Converts from Galactic coordinates to observed altitude and zenith ");
  std::operator+(&local_70,&local_50,
                 "coordinates for a given Julian date. Additional observing conditions ");
  std::operator+(&local_90,&local_70,
                 "an also be specified to allow more accurate coordinate values.");
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  CEExecOptions::AddGalacticPars(in_RDI);
  CEExecOptions::AddObserverPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("gal2obs");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Converts from Galactic coordinates to observed altitude and zenith " +
        "coordinates for a given Julian date. Additional observing conditions " +
        "an also be specified to allow more accurate coordinate values.");

    // Set the options
    opts.AddGalacticPars();
    opts.AddObserverPars();
    opts.AddJDPar();

    return opts;
}